

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_object_hasOwnProperty(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSAtom prop;
  int iVar1;
  JSValue v;
  
  prop = JS_ValueToAtom(ctx,*argv);
  if (prop == 0) {
    v = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
    v = JS_ToObject(ctx,this_val);
    if ((int)v.tag == 6) {
      JS_FreeAtom(ctx,prop);
    }
    else {
      iVar1 = JS_GetOwnPropertyInternal(ctx,(JSPropertyDescriptor *)0x0,(JSObject *)v.u.ptr,prop);
      JS_FreeAtom(ctx,prop);
      JS_FreeValue(ctx,v);
      v = (JSValue)(ZEXT816(6) << 0x40);
      if (-1 < iVar1) {
        v.u._1_7_ = 0;
        v.u.int32._0_1_ = iVar1 != 0;
        v.tag = 1;
      }
    }
  }
  return v;
}

Assistant:

static JSValue js_object_hasOwnProperty(JSContext *ctx, JSValueConst this_val,
                                        int argc, JSValueConst *argv)
{
    JSValue obj;
    JSAtom atom;
    JSObject *p;
    BOOL ret;

    atom = JS_ValueToAtom(ctx, argv[0]); /* must be done first */
    if (unlikely(atom == JS_ATOM_NULL))
        return JS_EXCEPTION;
    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj)) {
        JS_FreeAtom(ctx, atom);
        return obj;
    }
    p = JS_VALUE_GET_OBJ(obj);
    ret = JS_GetOwnPropertyInternal(ctx, NULL, p, atom);
    JS_FreeAtom(ctx, atom);
    JS_FreeValue(ctx, obj);
    if (ret < 0)
        return JS_EXCEPTION;
    else
        return JS_NewBool(ctx, ret);
}